

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

uint64 gflags::Uint64FromEnv(char *v,uint64 dflt)

{
  unsigned_long uVar1;
  uint64 dflt_local;
  char *v_local;
  
  uVar1 = anon_unknown_2::GetFromEnv<unsigned_long>(v,dflt);
  return uVar1;
}

Assistant:

uint64 Uint64FromEnv(const char *v, uint64 dflt) {
  return GetFromEnv(v, dflt);
}